

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall
llvm::raw_fd_ostream::changeColor(raw_fd_ostream *this,Colors colors,bool bold,bool bg)

{
  bool bVar1;
  void *__buf;
  bool bold_00;
  undefined7 in_register_00000009;
  ulong __n;
  char *local_38;
  size_t len;
  char *colorcode;
  bool bg_local;
  bool bold_local;
  Colors colors_local;
  raw_fd_ostream *this_local;
  
  __n = CONCAT71(in_register_00000009,bold) & 0xffffffffffffff01;
  bold_00 = SUB81(__n,0);
  bVar1 = sys::Process::ColorNeedsFlush();
  if (bVar1) {
    raw_ostream::flush((raw_ostream *)this);
  }
  if (colors == SAVEDCOLOR) {
    local_38 = sys::Process::OutputBold(bg);
  }
  else {
    __n = CONCAT71((int7)(__n >> 8),bold_00);
    local_38 = sys::Process::OutputColor((char)colors,bold_00,bg);
  }
  if (local_38 != (char *)0x0) {
    __buf = (void *)strlen(local_38);
    raw_ostream::write((raw_ostream *)this,(int)local_38,__buf,__n);
    this->pos = this->pos - (long)__buf;
  }
  return (raw_ostream *)this;
}

Assistant:

raw_ostream &raw_fd_ostream::changeColor(enum Colors colors, bool bold,
                                         bool bg) {
  if (sys::Process::ColorNeedsFlush())
    flush();
  const char *colorcode =
    (colors == SAVEDCOLOR) ? sys::Process::OutputBold(bg)
    : sys::Process::OutputColor(colors, bold, bg);
  if (colorcode) {
    size_t len = strlen(colorcode);
    write(colorcode, len);
    // don't account colors towards output characters
    pos -= len;
  }
  return *this;
}